

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_46c44b::KeyFrameIntervalTest_KeyFrameMaximumInterval_Test::
~KeyFrameIntervalTest_KeyFrameMaximumInterval_Test
          (KeyFrameIntervalTest_KeyFrameMaximumInterval_Test *this)

{
  void *in_RDI;
  
  ~KeyFrameIntervalTest_KeyFrameMaximumInterval_Test
            ((KeyFrameIntervalTest_KeyFrameMaximumInterval_Test *)0x56fec8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(KeyFrameIntervalTest, KeyFrameMaximumInterval) {
  for (unsigned int usage : { AOM_USAGE_GOOD_QUALITY, AOM_USAGE_REALTIME }) {
    // Test 0 and 1 (both mean all intra), some powers of 2, some multiples of
    // 10, and some prime numbers.
    for (unsigned int kf_max_dist :
         { 0, 1, 2, 3, 4, 7, 10, 13, 16, 20, 23, 29, 32 }) {
      TestKeyFrameMaximumInterval(usage, kf_max_dist);
    }
  }
}